

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UTrie2 * utrie2_openFromSerialized_63
                   (UTrie2ValueBits valueBits,void *data,int32_t length,int32_t *pActualLength,
                   UErrorCode *pErrorCode)

{
  ushort uVar1;
  uint16_t uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  UTrie2 *pUVar6;
  uint32_t uVar7;
  uint32_t *puVar8;
  int iVar9;
  uint uVar10;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UTrie2 *)0x0;
  }
  if ((length < 1) || (UTRIE2_32_VALUE_BITS < valueBits || ((ulong)data & 3) != 0)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    if (((0xf < length) && (*data == 0x54726932)) &&
       ((*(ushort *)((long)data + 4) & 0xf) == valueBits)) {
      uVar10 = (uint)*(ushort *)((long)data + 6);
      uVar1 = *(ushort *)((long)data + 8);
      iVar9 = -4;
      if (valueBits == UTRIE2_16_VALUE_BITS) {
        iVar9 = *(ushort *)((long)data + 6) - 4;
      }
      iVar5 = ((uint)uVar1 << (4U - (valueBits == UTRIE2_16_VALUE_BITS) & 0x1f)) + uVar10 * 2 + 0x10
      ;
      if (iVar5 <= length) {
        uVar2 = *(uint16_t *)((long)data + 10);
        uVar3 = *(ushort *)((long)data + 0xc);
        uVar4 = *(ushort *)((long)data + 0xe);
        pUVar6 = (UTrie2 *)uprv_malloc_63(0x50);
        if (pUVar6 == (UTrie2 *)0x0) {
          *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
          return (UTrie2 *)0x0;
        }
        pUVar6->index = (uint16_t *)0x0;
        pUVar6->data16 = (uint16_t *)0x0;
        pUVar6->data32 = (uint32_t *)0x0;
        pUVar6->indexLength = uVar10;
        pUVar6->dataLength = (uint)uVar1 << 2;
        pUVar6->index2NullOffset = uVar2;
        pUVar6->dataNullOffset = uVar3;
        pUVar6->initialValue = 0;
        pUVar6->errorValue = 0;
        pUVar6->highStart = (uint)uVar4 << 0xb;
        pUVar6->highValueIndex = iVar9 + (uint)uVar1 * 4;
        *(undefined8 *)&pUVar6->field_0x34 = 0;
        *(undefined8 *)((long)&pUVar6->memory + 4) = 0;
        pUVar6->length = 0;
        pUVar6->isMemoryOwned = '\0';
        pUVar6->padding1 = '\0';
        pUVar6->padding2 = 0;
        pUVar6->newTrie = (UNewTrie2 *)0x0;
        pUVar6->memory = data;
        pUVar6->length = iVar5;
        pUVar6->isMemoryOwned = '\0';
        pUVar6->index = (uint16_t *)((long)data + 0x10);
        puVar8 = (uint32_t *)((long)data + (ulong)uVar10 * 2 + 0x10);
        if ((valueBits & UTRIE2_32_VALUE_BITS) == UTRIE2_16_VALUE_BITS) {
          pUVar6->data16 = (uint16_t *)puVar8;
          pUVar6->data32 = (uint32_t *)0x0;
          pUVar6->initialValue = (uint)((uint16_t *)((long)data + 0x10))[uVar3];
          uVar7 = (uint32_t)*(ushort *)((long)data + (ulong)uVar10 * 2 + 0x110);
        }
        else {
          pUVar6->data16 = (uint16_t *)0x0;
          pUVar6->data32 = puVar8;
          pUVar6->initialValue = puVar8[uVar3];
          uVar7 = *(uint32_t *)((long)data + (ulong)uVar10 * 2 + 0x210);
        }
        pUVar6->errorValue = uVar7;
        if (pActualLength != (int32_t *)0x0) {
          *pActualLength = iVar5;
          return pUVar6;
        }
        return pUVar6;
      }
    }
    *pErrorCode = U_INVALID_FORMAT_ERROR;
  }
  return (UTrie2 *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }